

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

char * getnum(char *strp,int *nump,int min,int max)

{
  int iVar1;
  int *piVar2;
  int local_30;
  byte local_29;
  int num;
  char c;
  int max_local;
  int min_local;
  int *nump_local;
  char *strp_local;
  
  if (strp != (char *)0x0) {
    local_29 = *strp;
    iVar1 = isdigit((uint)local_29);
    if (iVar1 != 0) {
      local_30 = 0;
      nump_local = (int *)strp;
      do {
        local_30 = local_30 * 10 + (char)local_29 + -0x30;
        if (max < local_30) {
          return (char *)0x0;
        }
        piVar2 = (int *)((long)nump_local + 1);
        local_29 = *(byte *)((long)nump_local + 1);
        iVar1 = isdigit((uint)local_29);
        nump_local = piVar2;
      } while (iVar1 != 0);
      if (local_30 < min) {
        return (char *)0x0;
      }
      *nump = local_30;
      return (char *)piVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char * getnum( const char * strp, int * nump, int min, int max )
{
    char c;
    int  num;

    if ( strp == NULL || ! isdigit( (unsigned char)( c = *strp ) ) )
    {
        return NULL;
    }

    num = 0;

    do
    {
        num = num * 10 + ( c - '0' );

        if ( num > max )
        {
            return NULL;    /* illegal value */
        }

        c = *++strp;
    } while ( isdigit( (unsigned char)c ) );

    if ( num < min )
    {
        return NULL;        /* illegal value */
    }

    *nump = num;
    return strp;
}